

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setTriple(Triple *this,Twine *Str)

{
  Triple TStack_48;
  
  Triple(&TStack_48,Str);
  operator=(this,&TStack_48);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void Triple::setTriple(const Twine &Str) {
  *this = Triple(Str);
}